

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileParser::getVector2
          (ObjFileParser *this,
          vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *point2d_array)

{
  char *pBuffer;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  ai_real aVar2;
  aiVector2t<float> local_20;
  
  pBuffer = this->m_buffer;
  copyNextWord(this,pBuffer,0x1000);
  aVar2 = fast_atof(pBuffer);
  copyNextWord(this,pBuffer,0x1000);
  local_20.y = fast_atof(pBuffer);
  local_20.x = aVar2;
  std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::emplace_back<aiVector2t<float>>
            ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)point2d_array,&local_20)
  ;
  _Var1 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var1._M_current;
  return;
}

Assistant:

void ObjFileParser::getVector2( std::vector<aiVector2D> &point2d_array ) {
    ai_real x, y;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    point2d_array.push_back(aiVector2D(x, y));

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}